

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfcn.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  vector<Object,_std::allocator<Object>_> *objects_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  ulong uVar3;
  undefined4 uVar5;
  char *pcVar6;
  pointer pOVar7;
  int iVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  pointer pvVar11;
  void *pvVar12;
  char cVar13;
  int iVar14;
  ulong uVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  pointer pOVar21;
  int j;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float extraout_XMM0_Db;
  __m128 t_2;
  float extraout_XMM0_Db_00;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar31;
  float fVar32;
  __m128 t;
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  undefined1 auVar39 [16];
  float fVar42;
  vector<Object,_std::allocator<Object>_> objects;
  Extractor ex1;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  Mat bbox_pred;
  Mat rfcn_bbox;
  Mat cls_prob;
  Mat rois;
  value_type local_340;
  Mat im_info;
  Mat roi;
  Extractor ex2;
  Mat in;
  Mat rfcn_cls;
  Mat m;
  int local_1a0;
  int iStack_19c;
  uchar *local_198;
  float mean_vals [3];
  Net rfcn;
  
  if (argc == 2) {
    pcVar6 = argv[1];
    std::__cxx11::string::string((string *)&rfcn,pcVar6,(allocator *)&in);
    cv::imread((string *)&m,(int)&rfcn);
    std::__cxx11::string::~string((string *)&rfcn);
    cVar13 = cv::Mat::empty();
    if (cVar13 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&rfcn);
      rfcn.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&rfcn,"rfcn_end2end.param");
      ncnn::Net::load_model(&rfcn,"rfcn_end2end.bin");
      if (iStack_19c < local_1a0) {
        local_488._4_4_ = 224.0 / (float)iStack_19c;
        iVar19 = (int)((float)local_1a0 * (float)local_488._4_4_);
        iVar14 = 0xe0;
      }
      else {
        local_488._4_4_ = 224.0 / (float)local_1a0;
        iVar14 = (int)((float)iStack_19c * (float)local_488._4_4_);
        iVar19 = 0xe0;
      }
      ncnn::Mat::from_pixels_resize
                (&in,local_198,2,iStack_19c,local_1a0,iVar14,iVar19,(Allocator *)0x0);
      mean_vals[0] = 102.9801;
      mean_vals[1] = 115.9465;
      mean_vals[2] = 122.7717;
      ncnn::Mat::substract_mean_normalize(&in,mean_vals,(float *)0x0);
      ncnn::Mat::Mat(&im_info,3,4,(Allocator *)0x0);
      *(float *)im_info.data = (float)iVar19;
      *(float *)((long)im_info.data + 4) = (float)iVar14;
      *(undefined4 *)((long)im_info.data + 8) = local_488._4_4_;
      ncnn::Net::create_extractor((Net *)&ex1);
      ncnn::Extractor::input(&ex1,"data",&in);
      ncnn::Extractor::input(&ex1,"im_info",&im_info);
      rfcn_cls.cstep = 0;
      rfcn_cls.data = (void *)0x0;
      rfcn_cls.refcount._0_4_ = 0;
      rfcn_cls.refcount._4_4_ = 0;
      rfcn_cls.elemsize._0_4_ = 0;
      rfcn_cls.elemsize._4_4_ = 0;
      rfcn_cls.elempack = 0;
      rfcn_cls.allocator = (Allocator *)0x0;
      rfcn_cls.dims = 0;
      rfcn_bbox.cstep = 0;
      rfcn_cls.w = 0;
      rfcn_cls.h = 0;
      rfcn_cls.d = 0;
      rfcn_cls.c = 0;
      rfcn_bbox.data = (void *)0x0;
      rfcn_bbox.refcount._0_4_ = 0;
      rfcn_bbox.refcount._4_4_ = 0;
      rfcn_bbox.elemsize._0_4_ = 0;
      rfcn_bbox.elemsize._4_4_ = 0;
      rfcn_bbox.elempack = 0;
      rfcn_bbox.allocator = (Allocator *)0x0;
      rfcn_bbox.dims = 0;
      rfcn_bbox.w = 0;
      rfcn_bbox.h = 0;
      rfcn_bbox.d = 0;
      rfcn_bbox.c = 0;
      rois.cstep = 0;
      rois.data = (void *)0x0;
      rois.refcount._0_4_ = 0;
      rois.refcount._4_4_ = 0;
      rois.elemsize._0_4_ = 0;
      rois._20_8_ = 0;
      rois.allocator = (Allocator *)0x0;
      rois.dims = 0;
      rois.w = 0;
      rois.h = 0;
      rois.d = 0;
      rois.c = 0;
      ncnn::Extractor::extract(&ex1,"rfcn_cls",&rfcn_cls,0);
      ncnn::Extractor::extract(&ex1,"rfcn_bbox",&rfcn_bbox,0);
      ncnn::Extractor::extract(&ex1,"rois",&rois,0);
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_488._0_4_ = local_488._4_4_;
      fStack_480 = (float)local_488._4_4_;
      fStack_47c = (float)local_488._4_4_;
      for (iVar19 = 0; iVar19 < rois.c; iVar19 = iVar19 + 1) {
        ncnn::Net::create_extractor((Net *)&ex2);
        ncnn::Mat::channel(&roi,&rois,iVar19);
        ncnn::Extractor::input(&ex2,"rfcn_cls",&rfcn_cls);
        ncnn::Extractor::input(&ex2,"rfcn_bbox",&rfcn_bbox);
        ncnn::Extractor::input(&ex2,"rois",&roi);
        bbox_pred.cstep = 0;
        bbox_pred.data = (void *)0x0;
        bbox_pred.refcount._0_4_ = 0;
        bbox_pred.refcount._4_4_ = 0;
        bbox_pred.elemsize._0_4_ = 0;
        bbox_pred.elemsize._4_4_ = 0;
        bbox_pred.elempack = 0;
        bbox_pred.h = 0;
        bbox_pred.d = 0;
        bbox_pred.c = 0;
        bbox_pred.allocator = (Allocator *)0x0;
        bbox_pred.dims = 0;
        bbox_pred.w = 0;
        cls_prob.cstep = 0;
        cls_prob.data = (void *)0x0;
        cls_prob.refcount._0_4_ = 0;
        cls_prob.refcount._4_4_ = 0;
        cls_prob.elemsize._0_4_ = 0;
        cls_prob._20_8_ = 0;
        cls_prob.h = 0;
        cls_prob.d = 0;
        cls_prob.c = 0;
        cls_prob.allocator = (Allocator *)0x0;
        cls_prob.dims = 0;
        cls_prob.w = 0;
        ncnn::Extractor::extract(&ex2,"bbox_pred",&bbox_pred,0);
        ncnn::Extractor::extract(&ex2,"cls_prob",&cls_prob,0);
        iVar14 = cls_prob.w;
        std::
        vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
        ::resize(&class_candidates,(long)cls_prob.w);
        pvVar12 = bbox_pred.data;
        uVar17 = 0;
        uVar15 = (ulong)(uint)iVar14;
        if (iVar14 < 1) {
          uVar15 = uVar17;
        }
        fVar25 = 0.0;
        uVar20 = 0;
        for (; uVar15 != uVar17; uVar17 = uVar17 + 1) {
          fVar24 = *(float *)((long)cls_prob.data + uVar17 * 4);
          if (fVar25 < fVar24) {
            uVar20 = uVar17 & 0xffffffff;
            fVar25 = fVar24;
          }
        }
        iVar14 = (int)uVar20;
        if ((iVar14 != 0) && (0.6 < fVar25)) {
          uVar15 = *(ulong *)CONCAT44(roi.data._4_4_,(int)roi.data);
          uVar17 = ((ulong *)CONCAT44(roi.data._4_4_,(int)roi.data))[1];
          fVar24 = *(float *)((long)bbox_pred.data + 0x1c);
          fVar23 = expf(*(float *)((long)bbox_pred.data + 0x18));
          fVar24 = expf(fVar24);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar15;
          auVar34 = divps(auVar39,_local_488);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar17;
          auVar39 = divps(auVar9,_local_488);
          fVar38 = (auVar39._0_4_ - auVar34._0_4_) + (float)DAT_002d8040;
          fVar40 = (auVar39._4_4_ - auVar34._4_4_) + DAT_002d8040._4_4_;
          fVar41 = (auVar39._8_4_ - auVar34._8_4_) + DAT_002d8040._8_4_;
          fVar42 = (auVar39._12_4_ - auVar34._12_4_) + DAT_002d8040._12_4_;
          fVar28 = (float)*(undefined8 *)((long)pvVar12 + 0x10) * fVar38 +
                   fVar38 * 0.5 + auVar34._0_4_;
          fVar31 = (float)((ulong)*(undefined8 *)((long)pvVar12 + 0x10) >> 0x20) * fVar40 +
                   fVar40 * 0.5 + auVar34._4_4_;
          fVar32 = fVar41 * 0.0 + fVar41 * 0.0 + auVar34._8_4_;
          fVar33 = fVar42 * 0.0 + fVar42 * 0.0 + auVar34._12_4_;
          fVar23 = fVar23 * fVar38 * 0.5;
          fVar24 = fVar24 * fVar40 * 0.5;
          fVar38 = extraout_XMM0_Db * fVar41 * 0.0;
          fVar40 = extraout_XMM0_Db_00 * fVar42 * 0.0;
          auVar26._0_4_ = fVar28 - fVar23;
          auVar26._4_4_ = fVar31 - fVar24;
          auVar26._8_4_ = fVar32 - fVar38;
          auVar26._12_4_ = fVar33 - fVar40;
          auVar34._4_4_ = fVar24 + fVar31;
          auVar34._0_4_ = fVar23 + fVar28;
          auVar29._0_8_ = CONCAT44((float)(local_1a0 + -1),(float)(iStack_19c + -1));
          auVar29._8_4_ = 0xbf800000;
          auVar29._12_4_ = 0xbf800000;
          auVar35._8_4_ = 0xbf800000;
          auVar35._0_8_ = auVar29._0_8_;
          auVar35._12_4_ = 0xbf800000;
          auVar39 = minps(auVar35,auVar26);
          auVar39 = maxps(ZEXT816(0),auVar39);
          auVar34._8_4_ = fVar38 + fVar32;
          auVar34._12_4_ = fVar40 + fVar33;
          auVar34 = minps(auVar29,auVar34);
          auVar34 = maxps(ZEXT816(0),auVar34);
          local_340.rect.width = (auVar34._0_4_ - auVar39._0_4_) + (float)DAT_002d8040;
          local_340.rect.height = (auVar34._4_4_ - auVar39._4_4_) + DAT_002d8040._4_4_;
          local_340.rect._0_8_ = auVar39._0_8_;
          local_340.label = iVar14;
          local_340.prob = fVar25;
          std::vector<Object,_std::allocator<Object>_>::push_back
                    (class_candidates.
                     super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar14,&local_340);
        }
        ncnn::Mat::~Mat(&cls_prob);
        ncnn::Mat::~Mat(&bbox_pred);
        ncnn::Mat::~Mat(&roi);
        ncnn::Extractor::~Extractor(&ex2);
      }
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      for (lVar18 = 0;
          pvVar11 = class_candidates.
                    super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar18 < (int)(((long)class_candidates.
                                super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)class_candidates.
                               super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          lVar18 = lVar18 + 1) {
        objects_00 = class_candidates.
                     super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar18;
        qsort_descent_inplace(objects_00);
        bbox_pred.data = (void *)0x0;
        bbox_pred.refcount._0_4_ = 0;
        bbox_pred.refcount._4_4_ = 0;
        bbox_pred.elemsize._0_4_ = 0;
        bbox_pred.elemsize._4_4_ = 0;
        uVar15 = ((long)pvVar11[lVar18].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)pvVar11[lVar18].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x18;
        iVar19 = (int)uVar15;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&roi,(long)iVar19,
                   (allocator_type *)&cls_prob);
        uVar17 = 0;
        if (0 < iVar19) {
          uVar17 = uVar15 & 0xffffffff;
        }
        pfVar16 = &(((objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
          *(float *)(CONCAT44(roi.data._4_4_,(int)roi.data) + uVar15 * 4) = pfVar16[-1] * *pfVar16;
          pfVar16 = pfVar16 + 6;
        }
        iVar14 = 0;
        while( true ) {
          cls_prob.data = (void *)CONCAT44(cls_prob.data._4_4_,iVar14);
          if (iVar19 <= iVar14) break;
          pOVar7 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pOVar21 = pOVar7 + iVar14;
          uVar15 = (ulong)(CONCAT44(bbox_pred.refcount._4_4_,bbox_pred.refcount._0_4_) -
                          (long)bbox_pred.data) >> 2;
          uVar17 = uVar15 & 0xffffffff;
          if ((int)uVar15 < 1) {
            uVar17 = 0;
          }
          bVar10 = true;
          for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
            lVar22 = (long)*(int *)((long)bbox_pred.data + uVar15 * 4);
            uVar20._0_4_ = (pOVar21->rect).x;
            uVar20._4_4_ = (pOVar21->rect).y;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uVar20;
            uVar1 = (pOVar21->rect).width;
            uVar4 = (pOVar21->rect).height;
            uVar3._0_4_ = pOVar7[lVar22].rect.x;
            uVar3._4_4_ = pOVar7[lVar22].rect.y;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar3;
            uVar2 = pOVar7[lVar22].rect.width;
            uVar5 = pOVar7[lVar22].rect.height;
            auVar27._0_4_ = (float)uVar2 + (float)(undefined4)uVar3;
            auVar27._4_4_ = (float)uVar5 + (float)uVar3._4_4_;
            auVar27._8_8_ = 0;
            auVar39 = maxps(auVar37,auVar30);
            auVar36._0_4_ = (float)uVar1 + (float)(undefined4)uVar20;
            auVar36._4_4_ = (float)uVar4 + (float)uVar20._4_4_;
            auVar36._8_8_ = 0;
            auVar34 = minps(auVar27,auVar36);
            fVar25 = auVar34._0_4_ - auVar39._0_4_;
            fVar23 = auVar34._4_4_ - auVar39._4_4_;
            fVar24 = 0.0;
            if (0.0 < fVar23 && 0.0 < fVar25) {
              fVar24 = fVar25 * fVar23;
            }
            if (0.3 < fVar24 / ((*(float *)(CONCAT44(roi.data._4_4_,(int)roi.data) +
                                           (long)iVar14 * 4) +
                                *(float *)(CONCAT44(roi.data._4_4_,(int)roi.data) + lVar22 * 4)) -
                               fVar24)) {
              bVar10 = false;
            }
          }
          if (bVar10) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&bbox_pred,
                       (value_type_conflict1 *)&cls_prob);
            iVar14 = (int)cls_prob.data;
          }
          iVar14 = iVar14 + 1;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&roi);
        for (lVar22 = 0;
            lVar22 < (int)((ulong)(CONCAT44(bbox_pred.refcount._4_4_,bbox_pred.refcount._0_4_) -
                                  (long)bbox_pred.data) >> 2); lVar22 = lVar22 + 1) {
          std::vector<Object,_std::allocator<Object>_>::push_back
                    (&objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                              _M_impl.super__Vector_impl_data._M_start +
                              *(int *)((long)bbox_pred.data + lVar22 * 4));
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&bbox_pred);
      }
      qsort_descent_inplace(&objects);
      if (100 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x18)) {
        std::vector<Object,_std::allocator<Object>_>::resize(&objects,100);
      }
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::~vector(&class_candidates);
      ncnn::Mat::~Mat(&rois);
      ncnn::Mat::~Mat(&rfcn_bbox);
      ncnn::Mat::~Mat(&rfcn_cls);
      ncnn::Extractor::~Extractor(&ex1);
      ncnn::Mat::~Mat(&im_info);
      ncnn::Mat::~Mat(&in);
      ncnn::Net::~Net(&rfcn);
      cv::Mat::clone();
      lVar18 = 0;
      for (uVar15 = 0;
          pOVar7 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar15 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                                 .super__Vector_impl_data._M_start) / 0x18); uVar15 = uVar15 + 1) {
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                (double)*(float *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->prob + lVar18)
                ,(double)*(float *)((long)&((objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                   lVar18),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar18),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar18),
                SUB84((double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                height + lVar18),0),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar18)
               );
        im_info.elemsize = 0;
        im_info.data = (void *)CONCAT44(im_info.data._4_4_,0x3010000);
        pfVar16 = (float *)((long)&(pOVar7->rect).x + lVar18);
        rois.refcount._0_4_ = (int)ROUND(pfVar16[2]);
        rois.refcount._4_4_ = (int)ROUND(pfVar16[3]);
        rois.data = (void *)CONCAT44((int)ROUND(pfVar16[1]),(int)ROUND(*pfVar16));
        im_info.refcount = (int *)&in;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&rfcn);
        rfcn._vptr_Net = (_func_int **)0x406fe00000000000;
        rfcn.opt.lightmode = false;
        rfcn.opt._1_3_ = 0;
        rfcn.opt.num_threads = 0;
        rfcn.opt.blob_allocator = (Allocator *)0x0;
        rfcn.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle(&im_info,&rois,&rfcn,1,8,0);
        sprintf((char *)&rfcn,"%s %.1f%%",(double)(*(float *)((long)&pOVar7->prob + lVar18) * 100.0)
                ,_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                 *(int *)(_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                         + (long)*(int *)((long)&pOVar7->label + lVar18) * 4));
        class_candidates.
        super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)class_candidates.
                              super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        std::__cxx11::string::string((string *)&im_info,(char *)&rfcn,(allocator *)&rfcn_bbox);
        cv::getTextSize((string *)&bbox_pred,(int)&im_info,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)&im_info);
        iVar14 = (int)*(float *)((long)&(pOVar7->rect).x + lVar18);
        iVar19 = (int)((*(float *)((long)&(pOVar7->rect).y + lVar18) - (float)bbox_pred.data._4_4_)
                      - (float)(int)class_candidates.
                                    super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        if (iVar19 < 1) {
          iVar19 = 0;
        }
        iVar8 = in.refcount._4_4_ - (int)bbox_pred.data;
        if ((int)bbox_pred.data + iVar14 <= in.refcount._4_4_) {
          iVar8 = iVar14;
        }
        rfcn_bbox.elemsize._0_4_ = 0;
        rfcn_bbox.elemsize._4_4_ = 0;
        rfcn_bbox.data = (void *)CONCAT44(rfcn_bbox.data._4_4_,0x3010000);
        roi.refcount._4_4_ =
             (int)class_candidates.
                  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + bbox_pred.data._4_4_;
        roi.refcount._0_4_ = (int)bbox_pred.data;
        roi.data._0_4_ = iVar8;
        roi.data._4_4_ = iVar19;
        rfcn_bbox.refcount = (int *)&in;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&im_info);
        im_info.data = (void *)0x406fe00000000000;
        im_info.refcount = (int *)0x406fe00000000000;
        im_info.elemsize = 0x406fe00000000000;
        im_info.elempack = 0;
        im_info._28_4_ = 0;
        cv::rectangle(&rfcn_bbox,&roi,&im_info,0xffffffffffffffff,8,0);
        rfcn_bbox.elemsize._0_4_ = 0;
        rfcn_bbox.elemsize._4_4_ = 0;
        rfcn_bbox.data = (void *)CONCAT44(rfcn_bbox.data._4_4_,0x3010000);
        rfcn_bbox.refcount = (int *)&in;
        std::__cxx11::string::string((string *)&im_info,(char *)&rfcn,(allocator *)&local_340);
        cls_prob.data = (void *)CONCAT44(iVar19 + bbox_pred.data._4_4_,iVar8);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&rfcn_cls);
        rfcn_cls.elemsize._0_4_ = 0;
        rfcn_cls.elemsize._4_4_ = 0;
        rfcn_cls.elempack = 0;
        rfcn_cls._28_4_ = 0;
        rfcn_cls.data = (void *)0x0;
        rfcn_cls.refcount._0_4_ = 0;
        rfcn_cls.refcount._4_4_ = 0;
        cv::putText(0x3fe0000000000000,&rfcn_bbox,&im_info,&cls_prob,0,&rfcn_cls,1,8,0);
        std::__cxx11::string::~string((string *)&im_info);
        lVar18 = lVar18 + 0x18;
      }
      std::__cxx11::string::string((string *)&rfcn,"image",(allocator *)&rfcn_bbox);
      im_info.elemsize = 0;
      im_info.data = (void *)CONCAT44(im_info.data._4_4_,0x1010000);
      im_info.refcount = (int *)&in;
      cv::imshow((string *)&rfcn,(_InputArray *)&im_info);
      std::__cxx11::string::~string((string *)&rfcn);
      iVar19 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&in);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar6);
      iVar19 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar19 = -1;
  }
  return iVar19;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_rfcn(m, objects);

    draw_objects(m, objects);

    return 0;
}